

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

timeval * event_base_init_common_timeout(event_base *base,timeval *duration)

{
  short *psVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  common_timeout_list **ppcVar5;
  common_timeout_list *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  __suseconds_t *p_Var12;
  timeval *tv;
  ulong local_38;
  long local_30;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  uVar9 = duration->tv_usec;
  p_Var12 = &duration->tv_usec;
  if (1000000 < (long)uVar9) {
    lVar3 = duration->tv_sec;
    iVar4 = is_common_timeout(duration,base);
    uVar7 = (ulong)((uint)uVar9 & 0xfffff);
    if (iVar4 == 0) {
      uVar7 = uVar9;
    }
    uVar9 = uVar7 % 1000000;
    duration = (timeval *)&local_30;
    local_30 = uVar7 / 1000000 + lVar3;
    local_38 = uVar9;
    p_Var12 = (__suseconds_t *)&local_38;
  }
  uVar2 = base->n_common_timeouts;
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pcVar6 = base->common_timeout_queues[uVar7];
    if ((duration->tv_sec == (pcVar6->duration).tv_sec) &&
       (uVar9 == ((uint)(pcVar6->duration).tv_usec & 0xfffff))) {
      tv = &pcVar6->duration;
      iVar4 = is_common_timeout(tv,base);
      if (iVar4 != 0) goto LAB_00263fae;
      pcVar11 = "is_common_timeout(&ctl->duration, base)";
      uVar8 = 0x5ec;
      goto LAB_00264055;
    }
  }
  if (uVar2 == 0x100) {
    tv = (timeval *)0x0;
    event_warnx("%s: Too many common timeouts already in use; we only support %d per event_base",
                "event_base_init_common_timeout",0x100);
    goto LAB_00264006;
  }
  if (base->n_common_timeouts_allocated == uVar2) {
    uVar9 = 0x10;
    if (0xf < (int)uVar2) {
      uVar9 = (ulong)(uVar2 * 2);
    }
    ppcVar5 = (common_timeout_list **)event_mm_realloc_(base->common_timeout_queues,uVar9 * 8);
    if (ppcVar5 != (common_timeout_list **)0x0) {
      base->n_common_timeouts_allocated = (int)uVar9;
      base->common_timeout_queues = ppcVar5;
      goto LAB_00263ef9;
    }
    pcVar11 = "%s: realloc";
  }
  else {
LAB_00263ef9:
    pcVar6 = (common_timeout_list *)event_mm_calloc_(1,0xa8);
    if (pcVar6 != (common_timeout_list *)0x0) {
      (pcVar6->events).tqh_first = (event *)0x0;
      (pcVar6->events).tqh_last = (event **)pcVar6;
      tv = &pcVar6->duration;
      (pcVar6->duration).tv_sec = duration->tv_sec;
      (pcVar6->duration).tv_usec = (long)(base->n_common_timeouts << 0x14) | *p_Var12 | 0x50000000;
      event_assign(&pcVar6->timeout_event,base,-1,0,common_timeout_callback,pcVar6);
      psVar1 = &(pcVar6->timeout_event).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 | 0x10;
      event_priority_set(&pcVar6->timeout_event,0);
      pcVar6->base = base;
      iVar4 = base->n_common_timeouts;
      base->n_common_timeouts = iVar4 + 1;
      base->common_timeout_queues[iVar4] = pcVar6;
LAB_00263fae:
      iVar4 = is_common_timeout(tv,base);
      if (iVar4 == 0) {
        pcVar11 = "is_common_timeout(result, base)";
        uVar8 = 0x618;
LAB_00264055:
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,uVar8,pcVar11,"event_base_init_common_timeout");
      }
      goto LAB_00264006;
    }
    pcVar11 = "%s: calloc";
  }
  tv = (timeval *)0x0;
  event_warn(pcVar11,"event_base_init_common_timeout");
LAB_00264006:
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return tv;
}

Assistant:

const struct timeval *
event_base_init_common_timeout(struct event_base *base,
    const struct timeval *duration)
{
	int i;
	struct timeval tv;
	const struct timeval *result=NULL;
	struct common_timeout_list *new_ctl;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (duration->tv_usec > 1000000) {
		memcpy(&tv, duration, sizeof(struct timeval));
		if (is_common_timeout(duration, base))
			tv.tv_usec &= MICROSECONDS_MASK;
		tv.tv_sec += tv.tv_usec / 1000000;
		tv.tv_usec %= 1000000;
		duration = &tv;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		const struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		if (duration->tv_sec == ctl->duration.tv_sec &&
		    duration->tv_usec ==
		    (ctl->duration.tv_usec & MICROSECONDS_MASK)) {
			EVUTIL_ASSERT(is_common_timeout(&ctl->duration, base));
			result = &ctl->duration;
			goto done;
		}
	}
	if (base->n_common_timeouts == MAX_COMMON_TIMEOUTS) {
		event_warnx("%s: Too many common timeouts already in use; "
		    "we only support %d per event_base", __func__,
		    MAX_COMMON_TIMEOUTS);
		goto done;
	}
	if (base->n_common_timeouts_allocated == base->n_common_timeouts) {
		int n = base->n_common_timeouts < 16 ? 16 :
		    base->n_common_timeouts*2;
		struct common_timeout_list **newqueues =
		    mm_realloc(base->common_timeout_queues,
			n*sizeof(struct common_timeout_queue *));
		if (!newqueues) {
			event_warn("%s: realloc",__func__);
			goto done;
		}
		base->n_common_timeouts_allocated = n;
		base->common_timeout_queues = newqueues;
	}
	new_ctl = mm_calloc(1, sizeof(struct common_timeout_list));
	if (!new_ctl) {
		event_warn("%s: calloc",__func__);
		goto done;
	}
	TAILQ_INIT(&new_ctl->events);
	new_ctl->duration.tv_sec = duration->tv_sec;
	new_ctl->duration.tv_usec =
	    duration->tv_usec | COMMON_TIMEOUT_MAGIC |
	    (base->n_common_timeouts << COMMON_TIMEOUT_IDX_SHIFT);
	evtimer_assign(&new_ctl->timeout_event, base,
	    common_timeout_callback, new_ctl);
	new_ctl->timeout_event.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&new_ctl->timeout_event, 0);
	new_ctl->base = base;
	base->common_timeout_queues[base->n_common_timeouts++] = new_ctl;
	result = &new_ctl->duration;

done:
	if (result)
		EVUTIL_ASSERT(is_common_timeout(result, base));

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return result;
}